

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::clear(Board *this)

{
  Tile **ppTVar1;
  uint x;
  ulong uVar2;
  ulong uVar3;
  locale alStack_48 [8];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_40
  ;
  
  for (uVar3 = 0; uVar3 < (this->_size).y; uVar3 = uVar3 + 1) {
    uVar2 = 0;
    while( true ) {
      ppTVar1 = this->_tileArray[uVar3];
      if ((this->_size).x <= uVar2) break;
      if (ppTVar1[uVar2] != (Tile *)0x0) {
        (*ppTVar1[uVar2]->_vptr_Tile[1])();
      }
      uVar2 = uVar2 + 1;
    }
    if (ppTVar1 != (Tile **)0x0) {
      operator_delete__(ppTVar1);
    }
  }
  if (this->_tileArray != (Tile ***)0x0) {
    operator_delete__(this->_tileArray);
  }
  sf::VertexArray::clear(&this->_vertices);
  (this->_size).x = 0;
  (this->_size).y = 0;
  this->_tileArray = (Tile ***)0x0;
  local_40._M_dataplus._M_p = (pointer)0x0;
  sf::RectangleShape::setSize(&this->_notesBox,(Vector2f *)&local_40);
  std::locale::locale(alStack_48);
  sf::String::String((String *)&local_40,"",alStack_48);
  sf::Text::setString(&this->_notesText,(String *)&local_40);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_40);
  std::locale::~locale(alStack_48);
  this->changesMade = false;
  return;
}

Assistant:

void Board::clear() {
    for (unsigned int y = 0; y < _size.y; ++y) {
        for (unsigned int x = 0; x < _size.x; ++x) {
            delete _tileArray[y][x];
        }
        delete[] _tileArray[y];
    }
    delete[] _tileArray;
    _vertices.clear();
    _size = Vector2u(0, 0);
    _tileArray = nullptr;
    _notesBox.setSize(Vector2f(0.0f, 0.0f));
    _notesText.setString("");
    changesMade = false;
}